

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

blow_effect * lookup_monster_blow_effect(char *eff_name)

{
  blow_effect *pbVar1;
  int iVar2;
  blow_effect **ppbVar3;
  
  ppbVar3 = &blow_effects;
  while( true ) {
    pbVar1 = *ppbVar3;
    if (pbVar1 == (blow_effect *)0x0) {
      return (blow_effect *)0x0;
    }
    iVar2 = strcmp(pbVar1->name,eff_name);
    if (iVar2 == 0) break;
    ppbVar3 = &pbVar1->next;
  }
  return pbVar1;
}

Assistant:

struct blow_effect *lookup_monster_blow_effect(const char *eff_name) {
	struct blow_effect *eff = &blow_effects[0];
	while (eff) {
		if (streq(eff->name, eff_name))
			break;
		eff = eff->next;
	}
	return eff;
}